

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

Var __thiscall
Js::InterpreterStackFrame::ProcessThunk
          (InterpreterStackFrame *this,void *address,void *addressOfReturnAddress)

{
  Var pvVar1;
  undefined1 local_28 [8];
  PushPopFrameHelper pushPopFrameHelper;
  
  PushPopFrameHelper::PushPopFrameHelper
            ((PushPopFrameHelper *)local_28,this,address,addressOfReturnAddress);
  pvVar1 = Process(this);
  PushPopFrameHelper::~PushPopFrameHelper((PushPopFrameHelper *)local_28);
  return pvVar1;
}

Assistant:

_NOINLINE
        Var InterpreterStackFrame::ProcessThunk(void* address, void* addressOfReturnAddress)
    {
        PushPopFrameHelper pushPopFrameHelper(this, address, addressOfReturnAddress);
        return this->Process();
    }